

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall RandStrAtom::generate(RandStrAtom *this,wchar_t **dst)

{
  int *piVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  ulong uVar5;
  ulong lo2;
  ulong lo3;
  long *in_RSI;
  ulong in_RDI;
  ulong rand_val;
  RandStrRange *r;
  RandStrNode *chi;
  int picked;
  wchar_t n;
  wchar_t outc;
  ulong in_stack_ffffffffffffffb0;
  ulong in_stack_ffffffffffffffd0;
  ulong in_stack_ffffffffffffffd8;
  long lVar6;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_18;
  int local_14;
  
  local_14 = 0;
  if (*(int *)(in_RDI + 0x28) == 0) {
    if (*(int *)(in_RDI + 0x24) == 0) {
      uVar3 = rng_next();
      lo2 = (ulong)uVar3;
      lo3 = (ulong)(*(int *)(in_RDI + 0x20) - 0x41);
      switch(lo3) {
      case 0:
        uVar5 = rand_range(in_RDI,lo3,in_stack_ffffffffffffffb0);
        local_14 = (int)uVar5;
        break;
      default:
        return;
      case 0x17:
        uVar5 = rand_range(in_stack_ffffffffffffffd0,lo2,in_RDI,lo3,in_stack_ffffffffffffffb0);
        local_14 = (int)uVar5;
        break;
      case 0x20:
        uVar5 = rand_range(in_RDI,lo3,in_stack_ffffffffffffffb0);
        local_14 = (int)uVar5;
        break;
      case 0x21:
        uVar5 = rand_range(in_RDI,lo3,in_stack_ffffffffffffffb0);
        local_14 = (int)uVar5;
        break;
      case 0x22:
        uVar5 = rand_range(in_stack_ffffffffffffffd0,lo2,in_RDI,lo3,in_stack_ffffffffffffffb0);
        local_14 = (int)uVar5;
        break;
      case 0x23:
        uVar5 = rand_range(in_RDI,lo3,in_stack_ffffffffffffffb0);
        local_14 = (int)uVar5;
        break;
      case 0x28:
        uVar5 = rand_range(in_RDI,lo3,in_stack_ffffffffffffffb0);
        local_14 = (int)uVar5;
        break;
      case 0x2b:
        uVar5 = rand_range(in_stack_ffffffffffffffd0,lo2,in_RDI,lo3,in_stack_ffffffffffffffb0);
        local_14 = (int)uVar5;
        break;
      case 0x34:
        while( true ) {
          uVar5 = rand_range(CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,lo2,in_RDI,lo3,
                             (ulong)in_RSI);
          local_14 = (int)uVar5;
          iVar4 = t3_is_unichar(L'\0');
          if (iVar4 != 0) break;
          uVar3 = rng_next();
          lo2 = (ulong)uVar3;
        }
        break;
      case 0x37:
        uVar5 = rand_range(in_stack_ffffffffffffffd0,lo2,in_RDI,lo3,in_stack_ffffffffffffffb0);
        local_14 = (int)uVar5;
        break;
      case 0x39:
        uVar5 = rand_range(CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,lo2,in_RDI,lo3,
                           (ulong)in_RSI);
        local_14 = (int)uVar5;
      }
    }
    else {
      local_14 = *(int *)(in_RDI + 0x20);
    }
  }
  else {
    uVar3 = rng_next();
    uVar5 = rand_range((ulong)uVar3,(long)*(int *)(in_RDI + 0x28));
    local_18 = (int)uVar5;
    bVar2 = false;
    for (lVar6 = *(long *)(in_RDI + 8); lVar6 != 0; lVar6 = *(long *)(lVar6 + 0x18)) {
      if (local_18 <= *(int *)(lVar6 + 0x24) - *(int *)(lVar6 + 0x20)) {
        local_14 = *(int *)(lVar6 + 0x20) + local_18;
        bVar2 = true;
        break;
      }
      local_18 = local_18 - ((*(int *)(lVar6 + 0x24) - *(int *)(lVar6 + 0x20)) + 1);
    }
    if (!bVar2) {
      return;
    }
  }
  piVar1 = (int *)*in_RSI;
  *in_RSI = (long)(piVar1 + 1);
  *piVar1 = local_14;
  return;
}

Assistant:

virtual void generate(VMG_ wchar_t *&dst)
    {
        /* 
         *   If we have a character list expression, choose a character from
         *   the list.  Otherwise, generate a character according to our
         *   character class code.  
         */
        wchar_t outc = L'\0';
        if (listChars != 0)
        {
            /* pick a random index in our range */
            wchar_t n = (wchar_t)rand_range(rng_next(vmg0_), listChars);

			/* find the range containing this character */
			int picked = FALSE;
            for (RandStrNode *chi = firstChild ; chi != 0 ;
                 chi = chi->nextSibling)
            {
                /* cast the child - we know it's a range node */
                RandStrRange *r = (RandStrRange *)chi;

                /* if the index is in this range, we've found it */
                if (n <= r->c2 - r->c1)
                {
					outc = r->c1 + n;
					picked = TRUE;
                    break;
                }

                /* deduct the size of this range from the index */
                n -= (r->c2 - r->c1 + 1);
			}

			/* 
			 *   if we didn't pick a character, something's wrong - return
			 *   without generating anything 
			 */
			if (!picked)
				return;
        }
        else if (isLit)
        {
            /* literal character expression */
            outc = ch;
        }
        else
        {
            /* no list, so generate a character based on the class code */
            ulong rand_val = rng_next(vmg0_);
            switch (ch)
            {
            case 'i':
                /* printable ASCII character 32-126 */
                outc = (wchar_t)rand_range(rand_val, 32, 126);
                break;
                
            case 'l':
                /* printable Latin-1 character 32-126, 160-255 */
                outc = (wchar_t)rand_range(rand_val, 32, 126, 160, 255);
                break;
                
            case 'u':
                /* 
                 *   Printable Unicode character.  This excludes undefined
                 *   character, the private use area, and the control
                 *   characters.  
                 */
                for (;;)
                {
                    /* exclude the control and private use ranges */
                    outc = (wchar_t)rand_range(
                        rand_val, 32, 127, 160, 0xDFFF, 0xF900, 0xFFFE);
                    
                    /* if it's a unicode character, we're set */
                    if (t3_is_unichar(ch))
                        break;
                    
                    /* pick a new random number */
                    rand_val = rng_next(vmg0_);
                }
                break;
                
            case 'd':
                /* decimal digit 0-9 */
                outc = (wchar_t)rand_range(rand_val, '0', '9');
                break;
                
            case 'X':
                /* upper-case hex digit 0-9 A-F */
                outc = (wchar_t)rand_range(rand_val, '0', '9', 'A', 'F');
                break;
                
            case 'x':
                /* lower-case hex digit 0-9 a-f */
                outc = (wchar_t)rand_range(rand_val, '0', '9', 'a', 'f');
                break;
                
            case 'A':
                /* letter A-Z */
                outc = (wchar_t)rand_range(rand_val, 'A', 'Z');
                break;
                
            case 'a':
                /* letter a-z */
                outc = (wchar_t)rand_range(rand_val, 'a', 'z');
                break;
                
            case 'b':
                /* random byte value 0-255 */
                outc = (wchar_t)rand_range(rand_val, 0, 255);
                break;
                
            case 'c':
                /* mixed-case letter A-Z a-z */
                outc = (wchar_t)rand_range(rand_val, 'a', 'z', 'A', 'Z');
                break;
                
            case 'z':
                /* mixed-case letter or number 0-9 a-z A-Z */
                outc = (wchar_t)rand_range(rand_val,
                                           '0', '9', 'a', 'z', 'A', 'Z');
                break;

            default:
                /* no character */
                return;
            }
        }

        /* store the output character */
        *dst++ = outc;
    }